

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

Vec_Int_t * Vec_IntInvert(Vec_Int_t *p,int Fill)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (int *)0x0;
  uVar1 = p->nSize;
  if ((ulong)uVar1 != 0) {
    iVar7 = *p->pArray;
    if (1 < (int)uVar1) {
      uVar6 = 1;
      do {
        iVar2 = p->pArray[uVar6];
        if (iVar7 <= iVar2) {
          iVar7 = iVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    uVar1 = iVar7 + 1;
    if (-1 < iVar7) {
      piVar4 = (int *)malloc((ulong)uVar1 * 4);
      pVVar3->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar3->nCap = uVar1;
      if (-1 < iVar7) {
        memset(pVVar3->pArray,0xff,(ulong)uVar1 << 2);
      }
    }
    pVVar3->nSize = uVar1;
    if (0 < p->nSize) {
      piVar4 = p->pArray;
      lVar5 = 0;
      do {
        uVar1 = piVar4[lVar5];
        if ((ulong)uVar1 != 0xffffffff) {
          if (((int)uVar1 < 0) || (iVar7 < (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar3->pArray[uVar1] = (int)lVar5;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nSize);
    }
  }
  return pVVar3;
}

Assistant:

static inline Vec_Int_t * Vec_IntInvert( Vec_Int_t * p, int Fill ) 
{
    int Entry, i;
    Vec_Int_t * vRes = Vec_IntAlloc( 0 );
    if ( Vec_IntSize(p) == 0 )
        return vRes;
    Vec_IntFill( vRes, Vec_IntFindMax(p) + 1, Fill );
    Vec_IntForEachEntry( p, Entry, i )
        if ( Entry != Fill )
            Vec_IntWriteEntry( vRes, Entry, i );
    return vRes;
}